

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGParserCtxtPtr xmlRelaxNGNewMemParserCtxt(char *buffer,int size)

{
  xmlRelaxNGParserCtxtPtr ret;
  int size_local;
  char *buffer_local;
  
  if ((buffer == (char *)0x0) || (size < 1)) {
    buffer_local = (char *)0x0;
  }
  else {
    buffer_local = (char *)(*xmlMalloc)(0x110);
    if (buffer_local == (char *)0x0) {
      xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)0x0);
      buffer_local = (char *)0x0;
    }
    else {
      memset(buffer_local,0,0x110);
      *(char **)(buffer_local + 0xa0) = buffer;
      *(int *)(buffer_local + 0xa8) = size;
    }
  }
  return (xmlRelaxNGParserCtxtPtr)buffer_local;
}

Assistant:

xmlRelaxNGParserCtxtPtr
xmlRelaxNGNewMemParserCtxt(const char *buffer, int size)
{
    xmlRelaxNGParserCtxtPtr ret;

    if ((buffer == NULL) || (size <= 0))
        return (NULL);

    ret =
        (xmlRelaxNGParserCtxtPtr) xmlMalloc(sizeof(xmlRelaxNGParserCtxt));
    if (ret == NULL) {
        xmlRngPErrMemory(NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGParserCtxt));
    ret->buffer = buffer;
    ret->size = size;
    return (ret);
}